

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O2

UBool __thiscall icu_63::UCharsTrieBuilder::ensureCapacity(UCharsTrieBuilder *this,int32_t length)

{
  char16_t *pcVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  if (this->uchars == (char16_t *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    iVar3 = this->ucharsCapacity;
    if (this->ucharsCapacity < length) {
      do {
        iVar2 = iVar3;
        iVar3 = iVar2 * 2;
      } while (iVar3 <= length);
      pcVar1 = (char16_t *)uprv_malloc_63((long)(iVar2 << 2));
      bVar4 = pcVar1 == (char16_t *)0x0;
      if (bVar4) {
        pcVar1 = (char16_t *)0x0;
        iVar3 = 0;
      }
      else {
        iVar2 = this->ucharsLength;
        u_memcpy_63(pcVar1 + (iVar3 - iVar2),
                    this->uchars + ((long)this->ucharsCapacity - (long)iVar2),iVar2);
      }
      bVar4 = !bVar4;
      uprv_free_63(this->uchars);
      this->uchars = pcVar1;
      this->ucharsCapacity = iVar3;
    }
  }
  return bVar4;
}

Assistant:

UBool
UCharsTrieBuilder::ensureCapacity(int32_t length) {
    if(uchars==NULL) {
        return FALSE;  // previous memory allocation had failed
    }
    if(length>ucharsCapacity) {
        int32_t newCapacity=ucharsCapacity;
        do {
            newCapacity*=2;
        } while(newCapacity<=length);
        UChar *newUChars=static_cast<UChar *>(uprv_malloc(newCapacity*2));
        if(newUChars==NULL) {
            // unable to allocate memory
            uprv_free(uchars);
            uchars=NULL;
            ucharsCapacity=0;
            return FALSE;
        }
        u_memcpy(newUChars+(newCapacity-ucharsLength),
                 uchars+(ucharsCapacity-ucharsLength), ucharsLength);
        uprv_free(uchars);
        uchars=newUChars;
        ucharsCapacity=newCapacity;
    }
    return TRUE;
}